

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O0

bool __thiscall Assimp::MD5::MD5Parser::SkipSpacesAndLineEnd(MD5Parser *this,char *in,char **out)

{
  bool bVar1;
  bool running;
  bool bHad;
  char **out_local;
  char *in_local;
  MD5Parser *this_local;
  
  bVar1 = false;
  out_local = (char **)in;
  do {
    if ((*(char *)out_local == '\r') || (*(char *)out_local == '\n')) {
      if (!bVar1) {
        bVar1 = true;
        this->lineNumber = this->lineNumber + 1;
      }
    }
    else {
      if ((*(char *)out_local != '\t') && (*(char *)out_local != ' ')) {
        *out = (char *)out_local;
        return *(char *)out_local != '\0';
      }
      bVar1 = false;
    }
    out_local = (char **)((long)out_local + 1);
  } while( true );
}

Assistant:

bool SkipSpacesAndLineEnd( const char* in, const char** out)
    {
        bool bHad = false;
        bool running = true;
        while (running) {
            if( *in == '\r' || *in == '\n') {
                 // we open files in binary mode, so there could be \r\n sequences ...
                if (!bHad)  {
                    bHad = true;
                    ++lineNumber;
                }
            }
            else if (*in == '\t' || *in == ' ')bHad = false;
            else break;
            in++;
        }
        *out = in;
        return *in != '\0';
    }